

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::UnaryScatter<duckdb::BoolState,bool,duckdb::BoolOrFunFunction>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  char *pcVar1;
  undefined1 *puVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  undefined1 uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  idx_t iVar15;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_b8;
  long local_b0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if (((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) &&
       (count != 0)) {
      pcVar1 = *(char **)(input + 0x20);
      puVar2 = (undefined1 *)**(undefined8 **)(states + 0x20);
      do {
        *puVar2 = 0;
        uVar9 = puVar2[1];
        if (*pcVar1 != '\0') {
          uVar9 = 1;
        }
        puVar2[1] = uVar9;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (*input == (Vector)0x0 && *states == (Vector)0x0) {
    lVar3 = *(long *)(input + 0x20);
    lVar4 = *(long *)(states + 0x20);
    FlatVector::VerifyFlatVector(input);
    lVar5 = *(long *)(input + 0x28);
    if (lVar5 == 0) {
      if (count != 0) {
        iVar7 = 0;
        do {
          puVar2 = *(undefined1 **)(lVar4 + iVar7 * 8);
          *puVar2 = 0;
          uVar9 = puVar2[1];
          if (*(char *)(lVar3 + iVar7) != '\0') {
            uVar9 = 1;
          }
          puVar2[1] = uVar9;
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
      }
    }
    else if (0x3f < count + 0x3f) {
      uVar8 = 0;
      uVar11 = 0;
      do {
        uVar6 = *(ulong *)(lVar5 + uVar8 * 8);
        uVar12 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar12 = count;
        }
        uVar10 = uVar12;
        if (uVar6 != 0) {
          uVar10 = uVar11;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar11 < uVar12) {
              do {
                puVar2 = *(undefined1 **)(lVar4 + uVar10 * 8);
                *puVar2 = 0;
                uVar9 = puVar2[1];
                if (*(char *)(lVar3 + uVar10) != '\0') {
                  uVar9 = 1;
                }
                puVar2[1] = uVar9;
                uVar10 = uVar10 + 1;
              } while (uVar12 != uVar10);
            }
          }
          else if (uVar11 < uVar12) {
            uVar14 = 0;
            do {
              if ((uVar6 >> (uVar14 & 0x3f) & 1) != 0) {
                puVar2 = *(undefined1 **)(lVar4 + uVar11 * 8);
                *puVar2 = 0;
                uVar9 = puVar2[1];
                if (*(char *)(lVar3 + uVar11) != '\0') {
                  uVar9 = 1;
                }
                puVar2[1] = uVar9;
              }
              uVar11 = uVar11 + 1;
              uVar14 = uVar14 + 1;
              uVar10 = uVar11;
            } while (uVar12 != uVar11);
          }
        }
        uVar8 = uVar8 + 1;
        uVar11 = uVar10;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
    if (local_a8 == 0) {
      if (count != 0) {
        lVar3 = *local_b8;
        lVar4 = *local_70;
        iVar7 = 0;
        do {
          iVar13 = iVar7;
          if (lVar3 != 0) {
            iVar13 = (idx_t)*(uint *)(lVar3 + iVar7 * 4);
          }
          iVar15 = iVar7;
          if (lVar4 != 0) {
            iVar15 = (idx_t)*(uint *)(lVar4 + iVar7 * 4);
          }
          puVar2 = *(undefined1 **)(local_68 + iVar15 * 8);
          *puVar2 = 0;
          uVar9 = puVar2[1];
          if (*(char *)(local_b0 + iVar13) != '\0') {
            uVar9 = 1;
          }
          puVar2[1] = uVar9;
          iVar7 = iVar7 + 1;
        } while (count != iVar7);
      }
    }
    else if (count != 0) {
      lVar3 = *local_b8;
      lVar4 = *local_70;
      iVar7 = 0;
      do {
        iVar13 = iVar7;
        if (lVar3 != 0) {
          iVar13 = (idx_t)*(uint *)(lVar3 + iVar7 * 4);
        }
        iVar15 = iVar7;
        if (lVar4 != 0) {
          iVar15 = (idx_t)*(uint *)(lVar4 + iVar7 * 4);
        }
        if ((*(ulong *)(local_a8 + (iVar13 >> 6) * 8) >> (iVar13 & 0x3f) & 1) != 0) {
          puVar2 = *(undefined1 **)(local_68 + iVar15 * 8);
          *puVar2 = 0;
          uVar9 = puVar2[1];
          if (*(char *)(local_b0 + iVar13) != '\0') {
            uVar9 = 1;
          }
          puVar2[1] = uVar9;
        }
        iVar7 = iVar7 + 1;
      } while (count != iVar7);
    }
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
    if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}